

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsvg.c
# Opt level: O3

FT_Error ft_svg_render(FT_Renderer_conflict renderer,FT_GlyphSlot slot,FT_Render_Mode mode,
                      FT_Vector *origin)

{
  FT_UInt *pFVar1;
  FT_Memory memory;
  FT_Renderer_Class *pFVar2;
  uchar *puVar3;
  SVG_Renderer svg_renderer;
  FT_Error error;
  int local_2c;
  
  if (mode != FT_RENDER_MODE_NORMAL) {
    return 0x84;
  }
  if (*(char *)((long)&renderer[1].root.clazz + 1) == '\0') {
    return 0x9e;
  }
  memory = ((renderer->root).library)->memory;
  pFVar2 = renderer[1].clazz;
  if (*(char *)&renderer[1].root.clazz == '\0') {
    local_2c = (*(code *)renderer[1].root.library)(&renderer[1].glyph_class);
    *(undefined1 *)&renderer[1].root.clazz = 1;
    if (*(char *)((long)&renderer[1].root.clazz + 1) == '\0') goto LAB_0024dcb8;
  }
  (**(code **)&renderer[1].glyph_format)(slot,1,&renderer[1].glyph_class);
LAB_0024dcb8:
  puVar3 = (uchar *)ft_mem_alloc(memory,(ulong)(slot->bitmap).rows * (long)(slot->bitmap).pitch,
                                 &local_2c);
  (slot->bitmap).buffer = puVar3;
  if (local_2c == 0) {
    local_2c = (*(code *)pFVar2)(slot,&renderer[1].glyph_class);
    if (local_2c == 0) {
      pFVar1 = &slot->internal->flags;
      *pFVar1 = *pFVar1 | 1;
      local_2c = 0;
    }
    else {
      ft_mem_free(memory,(slot->bitmap).buffer);
      (slot->bitmap).buffer = (uchar *)0x0;
    }
  }
  return local_2c;
}

Assistant:

static FT_Error
  ft_svg_render( FT_Renderer       renderer,
                 FT_GlyphSlot      slot,
                 FT_Render_Mode    mode,
                 const FT_Vector*  origin )
  {
    SVG_Renderer  svg_renderer = (SVG_Renderer)renderer;

    FT_Library  library = renderer->root.library;
    FT_Memory   memory  = library->memory;
    FT_Error    error;

    FT_ULong  size_image_buffer;

    SVG_RendererHooks  hooks = svg_renderer->hooks;


    FT_UNUSED( mode );
    FT_UNUSED( origin );

    if ( mode != FT_RENDER_MODE_NORMAL )
      return FT_THROW( Bad_Argument );

    if ( svg_renderer->hooks_set == FALSE )
    {
      FT_TRACE1(( "Hooks are NOT set.  Can't render OT-SVG glyphs\n" ));
      return FT_THROW( Missing_SVG_Hooks );
    }

    if ( svg_renderer->loaded == FALSE )
    {
      FT_TRACE3(( "ft_svg_render: first rendering, calling init hook\n" ));
      error = hooks.init_svg( &svg_renderer->state );

      svg_renderer->loaded = TRUE;
    }

    ft_svg_preset_slot( (FT_Module)renderer, slot, TRUE );

    size_image_buffer = (FT_ULong)slot->bitmap.pitch * slot->bitmap.rows;
    /* No `FT_QALLOC` here since we need a clean, empty canvas */
    /* to start with.                                          */
    if ( FT_ALLOC( slot->bitmap.buffer, size_image_buffer ) )
      return error;

    error = hooks.render_svg( slot, &svg_renderer->state );
    if ( error )
      FT_FREE( slot->bitmap.buffer );
    else
      slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    return error;
  }